

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O1

void hta::storage::file::check(path *dir,bool fast)

{
  bool bVar1;
  uint uVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  size_type sVar4;
  TimePoint raw_epoch;
  TimePoint raw_end;
  long *plVar5;
  ostream *poVar6;
  size_t in_RCX;
  ulong uVar7;
  size_type *psVar8;
  uint __len;
  long lVar9;
  Duration interval;
  undefined7 in_register_00000031;
  char *pcVar10;
  Duration __val;
  long lVar11;
  string __str;
  path raw_path;
  path hta_path;
  File<hta::storage::file::Metric::Header,_hta::TimeValue> raw_file;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> hta_file;
  string_type local_5d8;
  long *local_5b8 [2];
  long local_5a8 [2];
  long local_598;
  long local_590;
  path *local_588;
  path local_580;
  path local_558;
  File<hta::storage::file::Metric::Header,_hta::TimeValue> local_530;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> local_2b0;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  pbVar3 = std::filesystem::__cxx11::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,dir);
  std::__ostream_insert<char,std::char_traits<char>>(pbVar3,"] Checking metric directory ",0x1c);
  pcVar10 = " full";
  if ((int)CONCAT71(in_register_00000031,fast) != 0) {
    pcVar10 = " fast";
  }
  std::__ostream_insert<char,std::char_traits<char>>(pbVar3,pcVar10,5);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar3 + -0x18) + (char)pbVar3);
  std::ostream::put((char)pbVar3);
  std::ostream::flush();
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            (&local_530.filename_,(char (*) [8])"raw.hta",auto_format);
  local_588 = dir;
  std::filesystem::__cxx11::operator/(&local_580,dir,&local_530.filename_);
  std::filesystem::__cxx11::path::~path(&local_530.filename_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  pbVar3 = std::filesystem::__cxx11::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_580);
  std::__ostream_insert<char,std::char_traits<char>>(pbVar3,"] Checking raw file",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar3 + -0x18) + (char)pbVar3);
  std::ostream::put((char)pbVar3);
  std::ostream::flush();
  File<hta::storage::file::Metric::Header,_hta::TimeValue>::File(&local_530);
  sVar4 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::size(&local_530);
  if (sVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    pbVar3 = std::filesystem::__cxx11::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_580);
    std::__ostream_insert<char,std::char_traits<char>>
              (pbVar3,"] Warning: empty raw file, aborting check.",0x2a);
    std::ios::widen((char)*(undefined8 *)(*(long *)pbVar3 + -0x18) + (char)pbVar3);
    std::ostream::put((char)pbVar3);
    std::ostream::flush();
  }
  else {
    raw_epoch.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
           File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                     (&local_530,0,(void *)0x0,in_RCX);
    sVar4 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::size(&local_530);
    raw_end.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                         (&local_530,(int)sVar4 + -1,(void *)0x0,in_RCX);
    if ((long)raw_end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)raw_epoch.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[",1);
      pbVar3 = std::filesystem::__cxx11::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,&local_580);
      std::__ostream_insert<char,std::char_traits<char>>
                (pbVar3,"] Error: First after last raw timestamp: ",0x29);
      std::ostream::_M_insert<long>((long)pbVar3);
      std::__ostream_insert<char,std::char_traits<char>>(pbVar3,", ",2);
      std::ostream::_M_insert<long>((long)pbVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)pbVar3 + -0x18) + (char)pbVar3);
      std::ostream::put((char)pbVar3);
      std::ostream::flush();
    }
    if (((long)raw_epoch.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r < 0xd234ccf52430000) ||
       ((long)future.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)raw_epoch.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[",1);
      pbVar3 = std::filesystem::__cxx11::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,&local_580);
      std::__ostream_insert<char,std::char_traits<char>>
                (pbVar3,"] Error: Implausible first raw timestamp: ",0x2a);
      std::ostream::_M_insert<long>((long)pbVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)pbVar3 + -0x18) + (char)pbVar3);
      std::ostream::put((char)pbVar3);
      std::ostream::flush();
    }
    if (((long)raw_end.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r < 0xd234ccf52430000) ||
       ((long)future.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)raw_end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[",1);
      pbVar3 = std::filesystem::__cxx11::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,&local_580);
      std::__ostream_insert<char,std::char_traits<char>>
                (pbVar3,"] Error: Implausible last raw timestamp: ",0x29);
      std::ostream::_M_insert<long>((long)pbVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)pbVar3 + -0x18) + (char)pbVar3);
      std::ostream::put((char)pbVar3);
      std::ostream::flush();
    }
    local_590 = local_530.header_.interval_factor;
    check_raw(&local_530,fast);
    if (local_530.header_.interval_min <= local_530.header_.interval_max) {
      local_598 = local_530.header_.interval_max;
      interval.__r = local_530.header_.interval_min;
      do {
        __val.__r = -interval.__r;
        if (0 < interval.__r) {
          __val.__r = interval.__r;
        }
        __len = 1;
        if (9 < (ulong)__val.__r) {
          uVar7 = __val.__r;
          uVar2 = 4;
          do {
            __len = uVar2;
            if (uVar7 < 100) {
              __len = __len - 2;
              goto LAB_001066da;
            }
            if (uVar7 < 1000) {
              __len = __len - 1;
              goto LAB_001066da;
            }
            if (uVar7 < 10000) goto LAB_001066da;
            bVar1 = 99999 < uVar7;
            uVar7 = uVar7 / 10000;
            uVar2 = __len + 4;
          } while (bVar1);
          __len = __len + 1;
        }
LAB_001066da:
        local_5b8[0] = local_5a8;
        std::__cxx11::string::_M_construct
                  ((ulong)local_5b8,(char)__len - (char)(interval.__r >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)((long)local_5b8[0] - (interval.__r >> 0x3f)),__len,__val.__r);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_5b8);
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_5d8.field_2._M_allocated_capacity = *psVar8;
          local_5d8.field_2._8_8_ = plVar5[3];
          local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
        }
        else {
          local_5d8.field_2._M_allocated_capacity = *psVar8;
          local_5d8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_5d8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::filesystem::__cxx11::path::path(&local_2b0.filename_,&local_5d8,auto_format);
        std::filesystem::__cxx11::operator/(&local_558,local_588,&local_2b0.filename_);
        std::filesystem::__cxx11::path::~path(&local_2b0.filename_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
          operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
        }
        if (local_5b8[0] != local_5a8) {
          operator_delete(local_5b8[0],local_5a8[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
        pbVar3 = std::filesystem::__cxx11::operator<<
                           ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_558);
        std::__ostream_insert<char,std::char_traits<char>>(pbVar3,"] Checking HTA file",0x13);
        std::ios::widen((char)*(undefined8 *)(*(long *)pbVar3 + -0x18) + (char)pbVar3);
        std::ostream::put((char)pbVar3);
        std::ostream::flush();
        File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::File(&local_2b0,&local_558);
        if (interval.__r != local_2b0.header_.interval) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[",1);
          pbVar3 = std::filesystem::__cxx11::operator<<
                             ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,&local_558)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(pbVar3,"] Error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pbVar3," mismatching interval: name: ",0x1d);
          std::ostream::_M_insert<long>((long)pbVar3);
          std::__ostream_insert<char,std::char_traits<char>>(pbVar3,", header: ",10);
          poVar6 = std::ostream::_M_insert<long>((long)pbVar3);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        if (((long)raw_epoch.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r < 0) ||
           ((long)raw_end.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r < 0)) {
          __assert_fail("time.time_since_epoch().count() >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/include/hta/types.hpp"
                        ,0x92,"TimePoint hta::interval_begin(TimePoint, Duration)");
        }
        lVar9 = (long)raw_epoch.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r -
                (long)raw_epoch.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r % interval.__r;
        lVar11 = (long)raw_end.
                       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       .__d.__r -
                 (long)raw_end.
                       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       .__d.__r % interval.__r;
        if (lVar9 == lVar11) {
          sVar4 = File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::size(&local_2b0);
          if (sVar4 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Top HTA file should be empty but it is not.",0x2b);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
            std::ostream::put(-0x78);
            std::ostream::flush();
          }
        }
        else {
          check_hta(&local_2b0,interval,raw_epoch,raw_end,fast);
        }
        std::fstream::~fstream(&local_2b0.stream_);
        std::filesystem::__cxx11::path::~path(&local_2b0.filename_);
        std::filesystem::__cxx11::path::~path(&local_558);
      } while ((lVar9 != lVar11) &&
              (interval.__r = interval.__r * local_590,
              interval.__r - local_598 == 0 || interval.__r < local_598));
    }
  }
  std::fstream::~fstream(&local_530.stream_);
  std::filesystem::__cxx11::path::~path(&local_530.filename_);
  std::filesystem::__cxx11::path::~path(&local_580);
  return;
}

Assistant:

void check(const std::filesystem::path dir, bool fast = false)
{
    std::cout << "[" << dir << "] Checking metric directory " << (fast ? " fast" : " full")
              << std::endl;

    auto raw_path = dir / std::filesystem::path("raw.hta");
    std::cout << "[" << raw_path << "] Checking raw file" << std::endl;
    File<Metric::Header, TimeValue> raw_file{ FileOpenTag::Read(), raw_path };

    if (raw_file.size() == 0)
    {
        std::cout << "[" << raw_path << "] Warning: empty raw file, aborting check." << std::endl;
        return;
    }
    auto raw_epoch = raw_file.read(0).time;
    auto raw_end = raw_file.read(raw_file.size() - 1).time;

    if (raw_epoch > raw_end)
    {
        std::cerr << "[" << raw_path << "] Error: First after last raw timestamp: " << raw_epoch
                  << ", " << raw_end << std::endl;
    }

    if (raw_epoch < genesis || raw_epoch > future)
    {
        std::cerr << "[" << raw_path << "] Error: Implausible first raw timestamp: " << raw_epoch
                  << std::endl;
    }

    if (raw_end < genesis || raw_end > future)
    {
        std::cerr << "[" << raw_path << "] Error: Implausible last raw timestamp: " << raw_end
                  << std::endl;
    }

    auto header = raw_file.header();
    check_raw(raw_file, fast);

    for (auto interval = Duration(header.interval_min); interval.count() <= header.interval_max;
         interval *= header.interval_factor)
    {

        auto hta_path = dir / (std::to_string(interval.count()) + ".hta");
        std::cout << "[" << hta_path << "] Checking HTA file" << std::endl;
        File<Metric::Header, TimeAggregate> hta_file{ FileOpenTag::Read(), hta_path };
        if (interval.count() != hta_file.header().interval)
        {
            std::cerr << "[" << hta_path << "] Error: "
                      << " mismatching interval: name: " << interval
                      << ", header: " << hta_file.header().interval << std::endl;
        }

        if (interval_begin(raw_epoch, interval) == interval_begin(raw_end, interval))
        {
            if (hta_file.size() != 0)
            {
                std::cerr << "Top HTA file should be empty but it is not." << std::endl;
            }
            break;
        }

        // TODO Check interval factor/min
        check_hta(hta_file, interval, raw_epoch, raw_end, fast);
    }
}